

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crossover.cc
# Opt level: O2

void __thiscall
ipx::Crossover::PushAll
          (Crossover *this,Basis *basis,Vector *x,Vector *y,Vector *z,double *weights,Info *info)

{
  double dVar1;
  double dVar2;
  Crossover *pCVar3;
  bool bVar4;
  Model *model;
  ostream *poVar5;
  long lVar6;
  Vector *pVVar7;
  Vector *this_00;
  size_t p;
  ulong uVar8;
  long lVar9;
  double dVar10;
  Int j;
  undefined4 uStack_2a4;
  size_type local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  Vector *local_288;
  Crossover *local_280;
  Vector *local_278;
  vector<int,_std::allocator<int>_> perm;
  vector<int,_std::allocator<int>_> primal_superbasics;
  vector<int,_std::allocator<int>_> dual_superbasics;
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream h_logging_stream;
  undefined1 local_1a8 [376];
  
  local_288 = x;
  model = Basis::model(basis);
  Sortperm(&perm,model->num_cols_ + model->num_rows_,weights,false);
  std::__cxx11::stringstream::stringstream((stringstream *)&h_logging_stream);
  _j = (pointer)&local_298;
  local_2a0 = 0;
  local_298._M_local_buf[0] = '\0';
  std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
  std::__cxx11::string::~string((string *)&j);
  Textline<char[35]>((string *)&j,(char (*) [35])"Primal residual before push phase:");
  poVar5 = std::operator<<((ostream *)local_1a8,(string *)&j);
  pVVar7 = local_288;
  dVar10 = PrimalResidual(model,local_288);
  sci2_abi_cxx11_(&local_1d8,(ipx *)pVVar7,dVar10);
  poVar5 = std::operator<<(poVar5,(string *)&local_1d8);
  poVar5 = std::operator<<(poVar5,'\n');
  Textline<char[33]>(&local_1f8,(char (*) [33])"Dual residual before push phase:");
  poVar5 = std::operator<<(poVar5,(string *)&local_1f8);
  pVVar7 = y;
  dVar10 = DualResidual(model,y,z);
  sci2_abi_cxx11_(&local_218,(ipx *)pVVar7,dVar10);
  poVar5 = std::operator<<(poVar5,(string *)&local_218);
  std::operator<<(poVar5,'\n');
  local_278 = y;
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&j);
  local_280 = this;
  Control::hLog(this->control_,&h_logging_stream);
  dual_superbasics.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  dual_superbasics.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  dual_superbasics.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  for (uVar8 = 0;
      uVar8 < (ulong)((long)perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2); uVar8 = uVar8 + 1) {
    j = perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [uVar8];
    bVar4 = Basis::IsBasic(basis,perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[uVar8]);
    if ((bVar4) && ((z->_M_data[j] != 0.0 || (NAN(z->_M_data[j]))))) {
      std::vector<int,_std::allocator<int>_>::push_back(&dual_superbasics,&j);
    }
  }
  Textline<char[32]>((string *)&j,(char (*) [32])"Number of dual pushes required:");
  poVar5 = std::operator<<((ostream *)local_1a8,(string *)&j);
  pVVar7 = local_278;
  pCVar3 = local_280;
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::operator<<(poVar5,'\n');
  std::__cxx11::string::~string((string *)&j);
  Control::hLog(pCVar3->control_,&h_logging_stream);
  PushDual(pCVar3,basis,pVVar7,z,&dual_superbasics,local_288,info);
  if ((info->super_ipx_info).status_crossover == 1) {
    primal_superbasics.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    primal_superbasics.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    primal_superbasics.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    lVar9 = (long)perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                  ._M_finish -
            (long)perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                  ._M_start >> 2;
    while (bVar4 = lVar9 != 0, lVar9 = lVar9 + -1, bVar4) {
      j = perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar9];
      bVar4 = Basis::IsNonbasic(basis,perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start[lVar9]);
      if (bVar4) {
        lVar6 = (long)j;
        dVar10 = local_288->_M_data[lVar6];
        dVar1 = (model->lb_)._M_data[lVar6];
        if ((dVar10 != dVar1) || (NAN(dVar10) || NAN(dVar1))) {
          dVar2 = (model->ub_)._M_data[lVar6];
          if ((dVar10 != dVar2) || (NAN(dVar10) || NAN(dVar2))) {
            if ((((dVar10 != 0.0) || (NAN(dVar10))) || (ABS(dVar1) != INFINITY)) ||
               (ABS(dVar2) != INFINITY)) {
              std::vector<int,_std::allocator<int>_>::push_back(&primal_superbasics,&j);
            }
          }
        }
      }
    }
    Textline<char[34]>((string *)&j,(char (*) [34])"Number of primal pushes required:");
    poVar5 = std::operator<<((ostream *)local_1a8,(string *)&j);
    pVVar7 = local_278;
    pCVar3 = local_280;
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::operator<<(poVar5,'\n');
    std::__cxx11::string::~string((string *)&j);
    Control::hLog(pCVar3->control_,&h_logging_stream);
    PushPrimal(pCVar3,basis,local_288,&primal_superbasics,(bool *)0x0,info);
    if ((info->super_ipx_info).status_crossover == 1) {
      poVar5 = Control::Debug(pCVar3->control_,1);
      Textline<char[34]>((string *)&j,(char (*) [34])"Primal residual after push phase:");
      poVar5 = std::operator<<(poVar5,(string *)&j);
      this_00 = local_288;
      dVar10 = PrimalResidual(model,local_288);
      sci2_abi_cxx11_(&local_1d8,(ipx *)this_00,dVar10);
      poVar5 = std::operator<<(poVar5,(string *)&local_1d8);
      poVar5 = std::operator<<(poVar5,'\n');
      Textline<char[32]>(&local_1f8,(char (*) [32])"Dual residual after push phase:");
      poVar5 = std::operator<<(poVar5,(string *)&local_1f8);
      dVar10 = DualResidual(model,pVVar7,z);
      sci2_abi_cxx11_(&local_218,(ipx *)pVVar7,dVar10);
      poVar5 = std::operator<<(poVar5,(string *)&local_218);
      std::operator<<(poVar5,'\n');
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&j);
      (info->super_ipx_info).status_crossover = 1;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&primal_superbasics.super__Vector_base<int,_std::allocator<int>_>);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&dual_superbasics.super__Vector_base<int,_std::allocator<int>_>);
  std::__cxx11::stringstream::~stringstream((stringstream *)&h_logging_stream);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&perm.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void Crossover::PushAll(Basis* basis, Vector& x, Vector& y, Vector& z,
                        const double* weights, Info* info) {
    const Model& model = basis->model();
    const Int m = model.rows();
    const Int n = model.cols();
    const Vector& lb = model.lb();
    const Vector& ub = model.ub();
    std::vector<Int> perm = Sortperm(n+m, weights, false);

    std::stringstream h_logging_stream;
    h_logging_stream.str(std::string());
    h_logging_stream
      << Textline("Primal residual before push phase:")
      << sci2(PrimalResidual(model, x)) << '\n'
      << Textline("Dual residual before push phase:")
      << sci2(DualResidual(model, y, z)) << '\n';
    control_.hLog(h_logging_stream);

    // Run dual push phase.
    std::vector<Int> dual_superbasics;
    for (size_t p = 0; p < perm.size(); p++) {
        Int j = perm[p];
        if (basis->IsBasic(j) && z[j] != 0.0)
            dual_superbasics.push_back(j);
    }
    h_logging_stream
        << Textline("Number of dual pushes required:")
        << dual_superbasics.size() << '\n';
	control_.hLog(h_logging_stream);
    PushDual(basis, y, z, dual_superbasics, x, info);
    assert(DualInfeasibility(model, x, z) == 0.0);
    if (info->status_crossover != IPX_STATUS_optimal)
        return;

    // Run primal push phase. Because z[j]==0 for all basic variables, none of
    // the primal variables is fixed at its bound.
    std::vector<Int> primal_superbasics;
    for (size_t p = perm.size(); p > 0; p--) {
        Int j = perm[p - 1];
        if (basis->IsNonbasic(j) && x[j] != lb[j] && x[j] != ub[j] &&
            !(std::isinf(lb[j]) && std::isinf(ub[j]) && x[j] == 0.0))
            primal_superbasics.push_back(j);
    }
    h_logging_stream
        << Textline("Number of primal pushes required:")
        << primal_superbasics.size() << '\n';
	control_.hLog(h_logging_stream);
    PushPrimal(basis, x, primal_superbasics, nullptr, info);
    assert(PrimalInfeasibility(model, x) == 0.0);
    if (info->status_crossover != IPX_STATUS_optimal)
        return;

    control_.Debug()
        << Textline("Primal residual after push phase:")
        << sci2(PrimalResidual(model, x)) << '\n'
        << Textline("Dual residual after push phase:")
        << sci2(DualResidual(model, y, z)) << '\n';
    info->status_crossover = IPX_STATUS_optimal;
}